

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O0

bool __thiscall
ON_ComponentManifestImpl::RemoveItem
          (ON_ComponentManifestImpl *this,ON_ComponentManifestItem_PRIVATE *manifest_item)

{
  bool bVar1;
  ON_ComponentManifestTableIndex *this_00;
  ON_ComponentNameHash32Table *this_01;
  ON_ComponentManifestTableIndex *table_index;
  ON_ComponentManifestItem_PRIVATE *item;
  ON_ComponentManifestItem_PRIVATE *manifest_item_local;
  ON_ComponentManifestImpl *this_local;
  
  if (manifest_item == (ON_ComponentManifestItem_PRIVATE *)0x0) {
    this_local._7_1_ = false;
  }
  else if (this->m_manifest_impl_sn == manifest_item->m_manifest_impl_sn) {
    this->m_manifest_content_version_number = this->m_manifest_content_version_number + 1;
    this_00 = TableIndexFromType(this,(manifest_item->super_ON_ComponentManifestItem).
                                      m_component_type);
    if (this_00 != (ON_ComponentManifestTableIndex *)0x0) {
      ON_ComponentManifestTableIndex::RemoveItem(this_00,manifest_item);
    }
    if ((manifest_item->super_ON_ComponentManifestItem).m_component_runtime_serial_number != 0) {
      ON_SerialNumberMap::RemoveSerialNumberAndId
                (&this->m_component_serial_number_map,
                 (manifest_item->super_ON_ComponentManifestItem).m_component_runtime_serial_number);
    }
    bVar1 = ON_UuidIsNotNil(&(manifest_item->super_ON_ComponentManifestItem).m_id);
    if (bVar1) {
      ON_ComponentIdHash32Table::RemoveManifestItem(&this->m_manifest_id_hash_table,manifest_item);
    }
    bVar1 = ON_NameHash::IsValidAndNotEmpty
                      (&(manifest_item->super_ON_ComponentManifestItem).m_name_hash);
    if (bVar1) {
      this_01 = ComponentNameHash32Table
                          (this,(manifest_item->super_ON_ComponentManifestItem).m_component_type);
      ON_ComponentNameHash32Table::RemoveManifestItem(this_01,manifest_item);
    }
    DeallocateItem(this,manifest_item);
    this_local._7_1_ = true;
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive_manifest.cpp"
               ,0x107f,"","manifest_item is corrupt.");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ComponentManifestImpl::RemoveItem(
  const ON_ComponentManifestItem_PRIVATE* manifest_item
  )
{
  if ( nullptr == manifest_item )
    return false;
  
  if (this->m_manifest_impl_sn != manifest_item->m_manifest_impl_sn )
  {
    ON_ERROR("manifest_item is corrupt.");
    return false;
  }

  ON_ComponentManifestItem_PRIVATE* item = const_cast<ON_ComponentManifestItem_PRIVATE*>(manifest_item);
  m_manifest_content_version_number++;
  ON_ComponentManifestTableIndex* table_index = TableIndexFromType(item->m_component_type);
  if (nullptr != table_index)
    table_index->RemoveItem(item);
  if ( 0 != item->m_component_runtime_serial_number )
    m_component_serial_number_map.RemoveSerialNumberAndId(item->m_component_runtime_serial_number);
  if (ON_UuidIsNotNil(item->m_id))
    m_manifest_id_hash_table.RemoveManifestItem(item);
  if (item->m_name_hash.IsValidAndNotEmpty())
   ComponentNameHash32Table(item->m_component_type).RemoveManifestItem(item);
  DeallocateItem(item);
  return true;
}